

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  pointer pcVar1;
  
  (this->super_SequentialFile)._vptr_SequentialFile =
       (_func_int **)&PTR__PosixSequentialFile_00133c20;
  fclose((FILE *)this->file_);
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  SequentialFile::~SequentialFile(&this->super_SequentialFile);
  return;
}

Assistant:

virtual ~PosixSequentialFile() { fclose(file_); }